

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaParseNewDocWithContext
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaPtr schema,xmlSchemaBucketPtr_conflict bucket)

{
  int iVar1;
  xmlSchemaBucketPtr_conflict pxVar2;
  xmlDocPtr pxVar3;
  int iVar4;
  xmlNodePtr node_00;
  xmlSchemaBucketPtr_conflict oldbucket;
  int oldErrs;
  int ret;
  xmlNodePtr node;
  xmlDocPtr oldDoc;
  int oldFlags;
  xmlSchemaBucketPtr_conflict bucket_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  pxVar2 = pctxt->constructor->bucket;
  iVar1 = schema->flags;
  pxVar3 = schema->doc;
  if (schema->flags != 0) {
    xmlSchemaClearSchemaDefaults(schema);
  }
  schema->doc = bucket->doc;
  pctxt->schema = schema;
  pctxt->targetNamespace = bucket->targetNamespace;
  pctxt->constructor->bucket = bucket;
  if ((bucket->targetNamespace != (xmlChar *)0x0) &&
     (iVar4 = xmlStrEqual(bucket->targetNamespace,xmlSchemaNs), iVar4 != 0)) {
    pctxt->isS4S = 1;
  }
  bucket->parsed = bucket->parsed + 1;
  node_00 = xmlDocGetRootElement(bucket->doc);
  oldbucket._4_4_ = xmlSchemaParseSchemaElement(pctxt,schema,node_00);
  if ((oldbucket._4_4_ == 0) && (node_00->children != (_xmlNode *)0x0)) {
    iVar4 = pctxt->nberrors;
    oldbucket._4_4_ = xmlSchemaParseSchemaTopLevel(pctxt,schema,node_00->children);
    if ((oldbucket._4_4_ == 0) && (iVar4 != pctxt->nberrors)) {
      oldbucket._4_4_ = pctxt->err;
    }
  }
  pctxt->constructor->bucket = pxVar2;
  schema->doc = pxVar3;
  schema->flags = iVar1;
  return oldbucket._4_4_;
}

Assistant:

static int
xmlSchemaParseNewDocWithContext(xmlSchemaParserCtxtPtr pctxt,
		     xmlSchemaPtr schema,
		     xmlSchemaBucketPtr bucket)
{
    int oldFlags;
    xmlDocPtr oldDoc;
    xmlNodePtr node;
    int ret, oldErrs;
    xmlSchemaBucketPtr oldbucket = pctxt->constructor->bucket;

    /*
    * Save old values; reset the *main* schema.
    * URGENT TODO: This is not good; move the per-document information
    * to the parser. Get rid of passing the main schema to the
    * parsing functions.
    */
    oldFlags = schema->flags;
    oldDoc = schema->doc;
    if (schema->flags != 0)
	xmlSchemaClearSchemaDefaults(schema);
    schema->doc = bucket->doc;
    pctxt->schema = schema;
    /*
    * Keep the current target namespace on the parser *not* on the
    * main schema.
    */
    pctxt->targetNamespace = bucket->targetNamespace;
    WXS_CONSTRUCTOR(pctxt)->bucket = bucket;

    if ((bucket->targetNamespace != NULL) &&
	xmlStrEqual(bucket->targetNamespace, xmlSchemaNs)) {
	/*
	* We are parsing the schema for schemas!
	*/
	pctxt->isS4S = 1;
    }
    /* Mark it as parsed, even if parsing fails. */
    bucket->parsed++;
    /* Compile the schema doc. */
    node = xmlDocGetRootElement(bucket->doc);
    ret = xmlSchemaParseSchemaElement(pctxt, schema, node);
    if (ret != 0)
	goto exit;
    /* An empty schema; just get out. */
    if (node->children == NULL)
	goto exit;
    oldErrs = pctxt->nberrors;
    ret = xmlSchemaParseSchemaTopLevel(pctxt, schema, node->children);
    if (ret != 0)
	goto exit;
    /*
    * TODO: Not nice, but I'm not 100% sure we will get always an error
    * as a result of the above functions; so better rely on pctxt->err
    * as well.
    */
    if ((ret == 0) && (oldErrs != pctxt->nberrors)) {
	ret = pctxt->err;
	goto exit;
    }

exit:
    WXS_CONSTRUCTOR(pctxt)->bucket = oldbucket;
    /* Restore schema values. */
    schema->doc = oldDoc;
    schema->flags = oldFlags;
    return(ret);
}